

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool __thiscall
bssl::spake2plus::Verifier::Init
          (Verifier *this,Span<const_unsigned_char> context,Span<const_unsigned_char> id_prover,
          Span<const_unsigned_char> id_verifier,Span<const_unsigned_char> w0,
          Span<const_unsigned_char> registration_record,Span<const_unsigned_char> y)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *group_00;
  uchar *puVar3;
  size_t sVar4;
  EC_GROUP *group;
  Verifier *this_local;
  Span<const_unsigned_char> id_prover_local;
  Span<const_unsigned_char> context_local;
  
  group_00 = EC_group_p256();
  puVar3 = Span<const_unsigned_char>::data(&w0);
  sVar4 = Span<const_unsigned_char>::size(&w0);
  iVar2 = ec_scalar_from_bytes(group_00,&this->w0_,puVar3,sVar4);
  if (iVar2 != 0) {
    puVar3 = Span<const_unsigned_char>::data(&registration_record);
    sVar4 = Span<const_unsigned_char>::size(&registration_record);
    iVar2 = ec_point_from_uncompressed(group_00,&this->L_,puVar3,sVar4);
    if (iVar2 != 0) {
      bVar1 = Span<const_unsigned_char>::empty(&y);
      if (!bVar1) {
        puVar3 = Span<const_unsigned_char>::data(&y);
        sVar4 = Span<const_unsigned_char>::size(&y);
        iVar2 = ec_scalar_from_bytes(group_00,&this->y_,puVar3,sVar4);
        if (iVar2 == 0) goto LAB_0022b52b;
      }
      bVar1 = Span<const_unsigned_char>::empty(&y);
      if ((!bVar1) ||
         (iVar2 = ec_random_scalar(group_00,&this->y_,(anonymous_namespace)::kDefaultAdditionalData)
         , iVar2 != 0)) {
        anon_unknown_0::InitTranscriptHash(&this->transcript_hash_,context,id_prover,id_verifier);
        return true;
      }
    }
  }
LAB_0022b52b:
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,0x18b);
  return false;
}

Assistant:

bool Verifier::Init(Span<const uint8_t> context, Span<const uint8_t> id_prover,
                    Span<const uint8_t> id_verifier, Span<const uint8_t> w0,
                    Span<const uint8_t> registration_record,
                    Span<const uint8_t> y) {
  const EC_GROUP *group = EC_group_p256();

  if (!ec_scalar_from_bytes(group, &w0_, w0.data(), w0.size()) ||
      !ec_point_from_uncompressed(group, &L_, registration_record.data(),
                                  registration_record.size()) ||  //
      (!y.empty() &&
       !ec_scalar_from_bytes(group, &y_, y.data(), y.size())) ||  //
      (y.empty() && !ec_random_scalar(group, &y_, kDefaultAdditionalData))) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  InitTranscriptHash(&transcript_hash_, context, id_prover, id_verifier);

  return true;
}